

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

int ImGuizmo::GetMoveType(vec_t *gizmoHitProportion)

{
  int iVar1;
  ImGuiIO *pIVar2;
  ulong uVar3;
  int iVar4;
  uint axisIndex;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool belowPlaneLimit;
  bool belowAxisLimit;
  vec_t dirPlaneY;
  vec_t dirPlaneX;
  vec_t direction [3];
  bool local_8a;
  bool local_89;
  vec_t local_88;
  vec_t local_78;
  undefined8 local_68;
  undefined8 auStack_60 [4];
  undefined8 uStack_40;
  
  pIVar2 = ImGui::GetIO();
  fVar9 = (pIVar2->MousePos).x;
  iVar1 = 0;
  if (((_DAT_001fc264 <= fVar9) && (iVar1 = 0, fVar9 <= DAT_001fc26c)) &&
     (fVar9 = (pIVar2->MousePos).y, iVar1 = 7, fVar9 < DAT_001fc268 || DAT_001fc270 < fVar9)) {
    iVar1 = 0;
  }
  local_68 = _DAT_001fc06c;
  auStack_60[0] = _DAT_001fc074;
  auStack_60[1] = _DAT_001fc07c;
  auStack_60[2] = _DAT_001fc084;
  auStack_60[3] = _DAT_001fc08c;
  uStack_40 = _DAT_001fc094;
  if (iVar1 == 0) {
    axisIndex = 0;
    do {
      ComputeTripodAxisAndVisibility(axisIndex,&local_78,&local_88,&local_89,&local_8a);
      vec_t::TransformVector(&local_78,(matrix_t *)&DAT_001fc06c);
      vec_t::TransformVector(&local_88,(matrix_t *)&DAT_001fc06c);
      uVar3 = (ulong)(axisIndex - 1);
      if (axisIndex == 0) {
        uVar3 = 2;
      }
      fVar9 = *(float *)(&local_68 + uVar3 * 2);
      fVar10 = *(float *)((long)&local_68 + uVar3 * 0x10 + 4);
      fVar7 = (float)auStack_60[uVar3 * 2];
      fVar6 = 1.0 / SQRT(fVar7 * fVar7 + fVar9 * fVar9 + fVar10 * fVar10);
      fVar9 = fVar9 * fVar6;
      fVar10 = fVar10 * fVar6;
      fVar7 = fVar6 * fVar7;
      fVar8 = fVar7 * DAT_001fc254 + fVar9 * DAT_001fc24c + fVar10 * DAT_001fc250;
      uVar5 = -(uint)(ABS(fVar8) < 1.1920929e-07);
      fVar10 = (float)(uVar5 & 0xbf800000 |
                      ~uVar5 & (uint)(-((DAT_001fc244 * fVar7 +
                                        DAT_001fc23c * fVar9 + fVar10 * DAT_001fc240) -
                                       (DAT_001fc0a8 *
                                        fVar6 * (float)((ulong)auStack_60[uVar3 * 2] >> 0x20) +
                                       DAT_001fc0a4 * fVar7 +
                                       fVar9 * DAT_001fc09c + DAT_001fc0a0 * fVar10)) / fVar8));
      fVar9 = 1.0 / DAT_001fc274;
      fVar6 = ((DAT_001fc24c * fVar10 + DAT_001fc23c) - DAT_001fc09c) * fVar9;
      fVar7 = ((DAT_001fc250 * fVar10 + DAT_001fc240) - DAT_001fc0a0) * fVar9;
      fVar9 = fVar9 * ((fVar10 * DAT_001fc254 + DAT_001fc244) - DAT_001fc0a4);
      fVar10 = fVar9 * local_78.z + fVar6 * local_78.x + fVar7 * local_78.y;
      fVar9 = fVar9 * local_88.z + fVar6 * local_88.x + fVar7 * local_88.y;
      iVar4 = axisIndex + 1;
      if (local_89 == false) {
        iVar4 = 0;
      }
      if (fVar9 <= -0.1) {
        iVar4 = 0;
      }
      if (0.1 <= fVar9) {
        iVar4 = 0;
      }
      if (fVar10 <= 0.1) {
        iVar4 = 0;
      }
      if (1.0 <= fVar10) {
        iVar4 = 0;
      }
      iVar1 = iVar4;
      if (local_8a != false) {
        iVar1 = axisIndex + 4;
      }
      if (fVar10 < 0.5) {
        iVar1 = iVar4;
      }
      if (0.8 < fVar10) {
        iVar1 = iVar4;
      }
      if (fVar9 < 0.5) {
        iVar1 = iVar4;
      }
      if (0.8 < fVar9) {
        iVar1 = iVar4;
      }
      if (gizmoHitProportion != (vec_t *)0x0) {
        gizmoHitProportion->x = fVar10;
        gizmoHitProportion->y = fVar9;
        gizmoHitProportion->z = 0.0;
        gizmoHitProportion->w = 0.0;
      }
    } while ((axisIndex < 2) && (axisIndex = axisIndex + 1, iVar1 == 0));
  }
  return iVar1;
}

Assistant:

static int GetMoveType(vec_t *gizmoHitProportion)
   {
      ImGuiIO& io = ImGui::GetIO();
      int type = NONE;

      // screen
      if (io.MousePos.x >= gContext.mScreenSquareMin.x && io.MousePos.x <= gContext.mScreenSquareMax.x &&
         io.MousePos.y >= gContext.mScreenSquareMin.y && io.MousePos.y <= gContext.mScreenSquareMax.y)
         type = MOVE_SCREEN;

      const vec_t direction[3] = { gContext.mModel.v.right, gContext.mModel.v.up, gContext.mModel.v.dir };

      // compute
      for (unsigned int i = 0; i < 3 && type == NONE; i++)
      {
         vec_t dirPlaneX, dirPlaneY;
         bool belowAxisLimit, belowPlaneLimit;
         ComputeTripodAxisAndVisibility(i, dirPlaneX, dirPlaneY, belowAxisLimit, belowPlaneLimit);
         dirPlaneX.TransformVector(gContext.mModel);
         dirPlaneY.TransformVector(gContext.mModel);

         const int planNormal = (i + 2) % 3;

         const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, BuildPlan(gContext.mModel.v.position, direction[planNormal]));
         vec_t posOnPlan = gContext.mRayOrigin + gContext.mRayVector * len;

         const float dx = dirPlaneX.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         const float dy = dirPlaneY.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         if (belowAxisLimit && dy > -0.1f && dy < 0.1f && dx > 0.1f  && dx < 1.f)
            type = MOVE_X + i;

         if (belowPlaneLimit && dx >= quadUV[0] && dx <= quadUV[4] && dy >= quadUV[1] && dy <= quadUV[3])
            type = MOVE_XY + i;

         if (gizmoHitProportion)
            *gizmoHitProportion = makeVect(dx, dy, 0.f);
      }
      return type;
   }